

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ASTVisitor.h
# Opt level: O0

Expression * __thiscall
soul::RewritingASTVisitor::visitObject(RewritingASTVisitor *this,Expression *t)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  undefined4 extraout_var_13;
  undefined4 extraout_var_14;
  undefined4 extraout_var_15;
  undefined4 extraout_var_16;
  undefined4 extraout_var_17;
  undefined4 extraout_var_18;
  undefined4 extraout_var_19;
  undefined4 extraout_var_20;
  undefined4 extraout_var_21;
  undefined4 extraout_var_22;
  undefined4 extraout_var_23;
  undefined4 extraout_var_24;
  undefined4 extraout_var_25;
  undefined4 extraout_var_26;
  undefined4 extraout_var_27;
  undefined4 extraout_var_28;
  undefined4 extraout_var_29;
  undefined4 extraout_var_30;
  undefined4 extraout_var_31;
  undefined4 extraout_var_32;
  undefined4 extraout_var_33;
  allocator<char> local_41;
  string local_40;
  Expression *local_20;
  Expression *t_local;
  RewritingASTVisitor *this_local;
  
  local_20 = t;
  t_local = (Expression *)this;
  switch((t->super_Statement).super_ASTObject.objectType) {
  case ConcreteType:
    iVar1 = (*this->_vptr_RewritingASTVisitor[0x21])(this,t);
    this_local = (RewritingASTVisitor *)CONCAT44(extraout_var,iVar1);
    break;
  case SubscriptWithBrackets:
    iVar1 = (*this->_vptr_RewritingASTVisitor[0x26])(this,t);
    this_local = (RewritingASTVisitor *)CONCAT44(extraout_var_00,iVar1);
    break;
  case SubscriptWithChevrons:
    iVar1 = (*this->_vptr_RewritingASTVisitor[0x27])(this,t);
    this_local = (RewritingASTVisitor *)CONCAT44(extraout_var_01,iVar1);
    break;
  case TypeMetaFunction:
    iVar1 = (*this->_vptr_RewritingASTVisitor[0x28])(this,t);
    this_local = (RewritingASTVisitor *)CONCAT44(extraout_var_02,iVar1);
    break;
  case Assignment:
    iVar1 = (*this->_vptr_RewritingASTVisitor[0xd])(this,t);
    this_local = (RewritingASTVisitor *)CONCAT44(extraout_var_03,iVar1);
    break;
  case BinaryOperator:
    iVar1 = (*this->_vptr_RewritingASTVisitor[9])(this,t);
    this_local = (RewritingASTVisitor *)CONCAT44(extraout_var_04,iVar1);
    break;
  case Constant:
    iVar1 = (*this->_vptr_RewritingASTVisitor[7])(this,t);
    this_local = (RewritingASTVisitor *)CONCAT44(extraout_var_05,iVar1);
    break;
  case DotOperator:
    iVar1 = (*this->_vptr_RewritingASTVisitor[0x36])(this,t);
    this_local = (RewritingASTVisitor *)CONCAT44(extraout_var_06,iVar1);
    break;
  case CallOrCast:
    iVar1 = (*this->_vptr_RewritingASTVisitor[0xe])(this,t);
    this_local = (RewritingASTVisitor *)CONCAT44(extraout_var_07,iVar1);
    break;
  case FunctionCall:
    iVar1 = (*this->_vptr_RewritingASTVisitor[0xf])(this,t);
    this_local = (RewritingASTVisitor *)CONCAT44(extraout_var_08,iVar1);
    break;
  case TypeCast:
    iVar1 = (*this->_vptr_RewritingASTVisitor[0x10])(this,t);
    this_local = (RewritingASTVisitor *)CONCAT44(extraout_var_09,iVar1);
    break;
  case PreOrPostIncOrDec:
    iVar1 = (*this->_vptr_RewritingASTVisitor[0x14])(this,t);
    this_local = (RewritingASTVisitor *)CONCAT44(extraout_var_10,iVar1);
    break;
  case InPlaceOperator:
    iVar1 = (*this->_vptr_RewritingASTVisitor[0x15])(this,t);
    this_local = (RewritingASTVisitor *)CONCAT44(extraout_var_11,iVar1);
    break;
  case ArrayElementRef:
    iVar1 = (*this->_vptr_RewritingASTVisitor[0x11])(this,t);
    this_local = (RewritingASTVisitor *)CONCAT44(extraout_var_12,iVar1);
    break;
  case StructMemberRef:
    iVar1 = (*this->_vptr_RewritingASTVisitor[0x12])(this,t);
    this_local = (RewritingASTVisitor *)CONCAT44(extraout_var_13,iVar1);
    break;
  case ComplexMemberRef:
    iVar1 = (*this->_vptr_RewritingASTVisitor[0x13])(this,t);
    this_local = (RewritingASTVisitor *)CONCAT44(extraout_var_14,iVar1);
    break;
  case StructDeclaration:
    iVar1 = (*this->_vptr_RewritingASTVisitor[0x22])(this,t);
    this_local = (RewritingASTVisitor *)CONCAT44(extraout_var_15,iVar1);
    break;
  case StructDeclarationRef:
    iVar1 = (*this->_vptr_RewritingASTVisitor[0x23])(this,t);
    this_local = (RewritingASTVisitor *)CONCAT44(extraout_var_16,iVar1);
    break;
  case UsingDeclaration:
    iVar1 = (*this->_vptr_RewritingASTVisitor[0x24])(this,t);
    this_local = (RewritingASTVisitor *)CONCAT44(extraout_var_17,iVar1);
    break;
  case TernaryOp:
    iVar1 = (*this->_vptr_RewritingASTVisitor[0x17])(this,t);
    this_local = (RewritingASTVisitor *)CONCAT44(extraout_var_18,iVar1);
    break;
  case UnaryOperator:
    iVar1 = (*this->_vptr_RewritingASTVisitor[10])(this,t);
    this_local = (RewritingASTVisitor *)CONCAT44(extraout_var_19,iVar1);
    break;
  case QualifiedIdentifier:
    iVar1 = (*this->_vptr_RewritingASTVisitor[0x34])(this,t);
    this_local = (RewritingASTVisitor *)CONCAT44(extraout_var_20,iVar1);
    break;
  case UnqualifiedName:
    iVar1 = (*this->_vptr_RewritingASTVisitor[0x35])(this,t);
    this_local = (RewritingASTVisitor *)CONCAT44(extraout_var_21,iVar1);
    break;
  case VariableRef:
    iVar1 = (*this->_vptr_RewritingASTVisitor[0xc])(this,t);
    this_local = (RewritingASTVisitor *)CONCAT44(extraout_var_22,iVar1);
    break;
  case InputEndpointRef:
    iVar1 = (*this->_vptr_RewritingASTVisitor[0x2b])(this,t);
    this_local = (RewritingASTVisitor *)CONCAT44(extraout_var_23,iVar1);
    break;
  case OutputEndpointRef:
    iVar1 = (*this->_vptr_RewritingASTVisitor[0x2c])(this,t);
    this_local = (RewritingASTVisitor *)CONCAT44(extraout_var_24,iVar1);
    break;
  case ConnectionEndpointRef:
    iVar1 = (*this->_vptr_RewritingASTVisitor[0x2d])(this,t);
    this_local = (RewritingASTVisitor *)CONCAT44(extraout_var_25,iVar1);
    break;
  case ProcessorRef:
    iVar1 = (*this->_vptr_RewritingASTVisitor[0x30])(this,t);
    this_local = (RewritingASTVisitor *)CONCAT44(extraout_var_26,iVar1);
    break;
  case NamespaceRef:
    iVar1 = (*this->_vptr_RewritingASTVisitor[0x31])(this,t);
    this_local = (RewritingASTVisitor *)CONCAT44(extraout_var_27,iVar1);
    break;
  case ProcessorInstanceRef:
    iVar1 = (*this->_vptr_RewritingASTVisitor[0x32])(this,t);
    this_local = (RewritingASTVisitor *)CONCAT44(extraout_var_28,iVar1);
    break;
  case CommaSeparatedList:
    iVar1 = (*this->_vptr_RewritingASTVisitor[0x33])(this,t);
    this_local = (RewritingASTVisitor *)CONCAT44(extraout_var_29,iVar1);
    break;
  case ProcessorProperty:
    iVar1 = (*this->_vptr_RewritingASTVisitor[0x1e])(this,t);
    this_local = (RewritingASTVisitor *)CONCAT44(extraout_var_30,iVar1);
    break;
  case WriteToEndpoint:
    iVar1 = (*this->_vptr_RewritingASTVisitor[0x1d])(this,t);
    this_local = (RewritingASTVisitor *)CONCAT44(extraout_var_31,iVar1);
    break;
  case AdvanceClock:
    iVar1 = (*this->_vptr_RewritingASTVisitor[0x1f])(this,t);
    this_local = (RewritingASTVisitor *)CONCAT44(extraout_var_32,iVar1);
    break;
  case StaticAssertion:
    iVar1 = (*this->_vptr_RewritingASTVisitor[0x37])(this,t);
    this_local = (RewritingASTVisitor *)CONCAT44(extraout_var_33,iVar1);
    break;
  default:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"Unknown AST expression",&local_41);
    throwInternalCompilerError(&local_40);
  }
  return (Expression *)this_local;
}

Assistant:

AST::Expression& visitObject (AST::Expression& t)
    {
        switch (t.objectType)
        {
            SOUL_AST_EXPRESSIONS (SOUL_INVOKE_FOR_SUBCLASS)
            default: throwInternalCompilerError ("Unknown AST expression"); return t;
        }
    }